

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O2

void __thiscall FTagManager::DumpTags(FTagManager *this)

{
  FTagItem *pFVar1;
  uint i;
  ulong uVar2;
  long lVar3;
  
  lVar3 = 4;
  for (uVar2 = 0; uVar2 < (this->allTags).Count; uVar2 = uVar2 + 1) {
    pFVar1 = (this->allTags).Array;
    Printf("Sector %d, tag %d\n",(ulong)*(uint *)((long)pFVar1 + lVar3 + -4),
           (ulong)*(uint *)((long)&pFVar1->target + lVar3));
    lVar3 = lVar3 + 0xc;
  }
  lVar3 = 4;
  for (uVar2 = 0; uVar2 < (this->allIDs).Count; uVar2 = uVar2 + 1) {
    pFVar1 = (this->allIDs).Array;
    Printf("Line %d, ID %d\n",(ulong)*(uint *)((long)pFVar1 + lVar3 + -4),
           (ulong)*(uint *)((long)&pFVar1->target + lVar3));
    lVar3 = lVar3 + 0xc;
  }
  return;
}

Assistant:

void FTagManager::DumpTags()
{
	for (unsigned i = 0; i < allTags.Size(); i++)
	{
		Printf("Sector %d, tag %d\n", allTags[i].target, allTags[i].tag);
	}
	for (unsigned i = 0; i < allIDs.Size(); i++)
	{
		Printf("Line %d, ID %d\n", allIDs[i].target, allIDs[i].tag);
	}
}